

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

bool __thiscall
xemmai::ast::t_block::f_forward
          (t_block *this,
          vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
          *a_privates)

{
  size_type __new_size;
  value_type *pvVar1;
  const_reference pvVar2;
  reference pvVar3;
  value_type *x;
  size_t i;
  bool b;
  vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
  *a_privates_local;
  t_block *this_local;
  
  i._7_1_ = (this->v_forward & 1U) == 0;
  if (i._7_1_) {
    this->v_forward = true;
    __new_size = std::
                 vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                 ::size(a_privates);
    std::vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>::
    resize(&this->v_privates,__new_size);
  }
  for (x = (value_type *)0x0;
      pvVar1 = (value_type *)
               std::
               vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
               ::size(a_privates), x < pvVar1; x = (value_type *)&x->v_out) {
    pvVar2 = std::
             vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
             ::operator[](a_privates,(size_type)x);
    if (((pvVar2->v_out & 1U) != 0) &&
       (pvVar3 = std::
                 vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                 ::operator[](&this->v_privates,(size_type)x), (pvVar3->v_in & 1U) == 0)) {
      i._7_1_ = true;
      pvVar3->v_out = true;
      pvVar3->v_in = true;
    }
  }
  return i._7_1_;
}

Assistant:

bool t_block::f_forward(const std::vector<t_private>& a_privates)
{
	bool b = false;
	if (!v_forward) {
		v_forward = b = true;
		v_privates.resize(a_privates.size());
	}
	for (size_t i = 0; i < a_privates.size(); ++i) {
		if (!a_privates[i].v_out) continue;
		auto& x = v_privates[i];
		if (!x.v_in) x.v_in = x.v_out = b = true;
	}
	return b;
}